

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch2DocsSamples.cpp
# Opt level: O2

string * __thiscall
Greeting::getNationality_abi_cxx11_(string *__return_storage_ptr__,Greeting *this)

{
  Nationality NVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  NVar1 = this->nationality;
  if (NVar1 == French) {
    __s = "French";
    __a = &local_b;
  }
  else if (NVar1 == American) {
    __s = "American";
    __a = &local_a;
  }
  else if (NVar1 == British) {
    __s = "British";
    __a = &local_9;
  }
  else {
    __s = "Unknown";
    __a = &local_c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string getNationality() const
    {
        switch (nationality)
        {
        case British:
            return "British";
        case American:
            return "American";
        case French:
            return "French";
        default:
            return "Unknown";
        }
    }